

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

void __thiscall
QPDF_Array::QPDF_Array
          (QPDF_Array *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *v,
          bool sparse)

{
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var3;
  __uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> __p;
  tuple<QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_> in_RAX;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined3 in_register_00000011;
  QPDFObjectHandle *item;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *__r;
  __uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> local_28;
  
  (this->elements).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elements).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sp)._M_t.
  super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
  super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
  super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl = (Sparse *)0x0;
  (this->elements).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (CONCAT31(in_register_00000011,sparse) != 0) {
    local_28._M_t.
    super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
    super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl =
         (tuple<QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>)
         (tuple<QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>)
         in_RAX.
         super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
         super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
    std::make_unique<QPDF_Array::Sparse>();
    __p._M_t.super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
    super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl =
         local_28._M_t.
         super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
         super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
    local_28._M_t.
    super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
    super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl =
         (tuple<QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>)
         (_Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>)0x0;
    std::__uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::reset
              ((__uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> *)this
               ,(pointer)__p._M_t.
                         super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                         .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl);
    std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::~unique_ptr
              ((unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> *)&local_28
              );
    p_Var1 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             (v->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (__r = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
               (v->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
               super__Vector_impl_data._M_start; __r != p_Var1; __r = __r + 1) {
      peVar2 = __r->_M_ptr;
      if (((peVar2 == (element_type *)0x0) ||
          (*(__index_type *)
            ((long)&(peVar2->value).
                    super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            + 0x30) != '\x02')) || ((peVar2->og).obj != 0)) {
        _Var3._M_head_impl =
             (this->sp)._M_t.
             super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>.
             _M_t.
             super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
             super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
        this_00 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                  std::
                  map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                  ::operator[](&(_Var3._M_head_impl)->elements,&(_Var3._M_head_impl)->size);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=(this_00,__r);
      }
      _Var3._M_head_impl =
           (this->sp)._M_t.
           super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
           super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
           super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
      (_Var3._M_head_impl)->size = (_Var3._M_head_impl)->size + 1;
    }
    return;
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::_M_move_assign
            (&this->elements,v);
  return;
}

Assistant:

QPDF_Array::QPDF_Array(std::vector<QPDFObjectHandle>&& v, bool sparse)
{
    if (sparse) {
        sp = std::make_unique<Sparse>();
        for (auto& item: v) {
            if (item.raw_type_code() != ::ot_null || item.indirect()) {
                sp->elements[sp->size] = std::move(item);
            }
            ++sp->size;
        }
    } else {
        elements = std::move(v);
    }
}